

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

bool __thiscall om::concurrency::queue<int>::dequeue(queue<int> *this,int *item_)

{
  int *piVar1;
  int *piVar2;
  
  std::mutex::lock(&this->_mutex);
  piVar1 = (this->_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  piVar2 = (this->_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 != piVar1) {
    *item_ = *piVar1;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->_queue).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return piVar2 != piVar1;
}

Assistant:

bool dequeue(T& item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);

				if(_queue.empty())
					return false;

				item_ = std::move(_queue.front());
				_queue.pop();
				return true;
			}